

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.h
# Opt level: O0

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxDevexPR(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  char *in_RDI;
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  *this_00;
  type *in_stack_ffffffffffffffa0;
  longlong in_stack_ffffffffffffffa8;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffffb0;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffc0;
  undefined4 local_2c [3];
  undefined8 local_20;
  undefined4 *local_18;
  char *local_10;
  undefined4 *local_8;
  
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxPricer(in_stack_ffffffffffffffc0,in_RDI);
  *(undefined ***)in_RDI = &PTR_getName_0089a058;
  local_10 = in_RDI + 0x68;
  local_2c[0] = 0;
  local_18 = local_2c;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = (Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
             *)(in_RDI + 0xa0);
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array(this_00,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array(this_00,(int)((ulong)(in_RDI + 0xb8) >> 0x20));
  DIdxSet::DIdxSet((DIdxSet *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  DIdxSet::DIdxSet((DIdxSet *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  in_RDI[0x110] = '\0';
  return;
}

Assistant:

SPxDevexPR()
      : SPxPricer<R>("Devex")
      , last(0)
      , refined(false)
   {}